

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int __thiscall
section_data::analyze_line_seg(section_data *this,int *line_start,int *line_end,int layer)

{
  int iVar1;
  ostream *poVar2;
  int local_30;
  int ret;
  int section_type;
  int line_type;
  int layer_local;
  int *line_end_local;
  int *line_start_local;
  section_data *this_local;
  
  section_type = layer;
  _line_type = line_end;
  line_end_local = line_start;
  line_start_local = (int *)this;
  ret = calibrate_line(line_start,line_end);
  iVar1 = set_section_type(&ret,&this->axis_type);
  switch(iVar1) {
  case 1:
    local_30 = slice_horiz_horiz(this,line_end_local,_line_type,&section_type);
    break;
  case 2:
    local_30 = slice_horiz_angled(this,line_end_local,_line_type,&section_type);
    break;
  case 3:
    local_30 = slice_horiz_vertical(this,line_end_local,_line_type,&section_type);
    break;
  case 4:
    local_30 = slice_angled_horiz(this,line_end_local,_line_type,&section_type);
    break;
  case 5:
    local_30 = slice_angled_angled(this,line_end_local,_line_type,&section_type);
    break;
  case 6:
    local_30 = slice_angled_vertical(this,line_end_local,_line_type,&section_type);
    break;
  case 7:
    local_30 = slice_vertical_horiz(this,line_end_local,_line_type,&section_type);
    break;
  case 8:
    local_30 = slice_vertical_angled(this,line_end_local,_line_type,&section_type);
    break;
  case 9:
    local_30 = slice_vert_vert(this,line_end_local,_line_type,&section_type);
    break;
  default:
    poVar2 = std::operator<<((ostream *)&std::cout,"Error analyzing line_segment. Unhandled state.")
    ;
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_30 = 1;
    break;
  case 99:
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Error analyzing line_segment. Unrecognized cross-section interaction."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_30 = 1;
  }
  return local_30;
}

Assistant:

int section_data::analyze_line_seg(int line_start[2], int line_end[2],
                                   int layer) // axis_type
{
  // enforce sorting
  int line_type = calibrate_line(line_start, line_end);
  int section_type = set_section_type(line_type, axis_type);
  int ret;
  // map<int, vector<double>> layer_intercepts;          // key = layer number
  switch (section_type) {
  case 1: // Horizontal-horizontal
    ret = slice_horiz_horiz(line_start, line_end, layer);
    break;
  case 2: // Horizontal-angled
    ret = slice_horiz_angled(line_start, line_end, layer);
    break;
  case 3: // Horizontal-vertical
    ret = slice_horiz_vertical(line_start, line_end, layer);
    break;
  case 4: // Angled-horizontal
    ret = slice_angled_horiz(line_start, line_end, layer);
    break;
  case 5: // Angled-angled
    ret = slice_angled_angled(line_start, line_end, layer);
    break;
  case 6: // Angled-vertical
    ret = slice_angled_vertical(line_start, line_end, layer);
    break;
  case 7: // Vertical-horizontal
    ret = slice_vertical_horiz(line_start, line_end, layer);
    break;
  case 8: // Vertical-angled
    ret = slice_vertical_angled(line_start, line_end, layer);
    break;
  case 9: // Vertical-vertical
    ret = slice_vert_vert(line_start, line_end, layer);
    break;
  case 99:
    cout << "Error analyzing line_segment. Unrecognized cross-section "
            "interaction."
         << endl;
    ret = EXIT_FAILURE;
    break;
  default:
    cout << "Error analyzing line_segment. Unhandled state." << endl;
    ret = EXIT_FAILURE;
    break;
  }
  return ret;
}